

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall GlobOpt::GetVarConstantValue(GlobOpt *this,AddrOpnd *addrOpnd)

{
  Sym *pSVar1;
  ValueInfo *this_00;
  bool isString;
  bool bVar2;
  Value *pVVar3;
  VarConstantValueInfo *pVVar4;
  JITJavascriptString *pJVar5;
  Var var;
  undefined1 local_60 [8];
  InternalString cachedInternalString;
  InternalString internalString;
  Value *local_38;
  Value *cachedValue;
  
  if (((addrOpnd->addrOpndKind == AddrOpndKindDynamicVar) ||
      (addrOpnd->addrOpndKind == AddrOpndKindConstantVar)) && (addrOpnd->m_localAddress != (Var)0x0)
     ) {
    isString = JITJavascriptString::Is(addrOpnd->m_localAddress);
  }
  else {
    isString = false;
  }
  local_38 = (Value *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->addrConstantToValueMap,&addrOpnd->m_address,&local_38);
  if (bVar2) {
    pSVar1 = local_38->valueInfo->symStore;
    if ((((pSVar1 != (Sym *)0x0) &&
         (bVar2 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,pSVar1), bVar2)) &&
        (pVVar3 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,pSVar1),
        pVVar3 != (Value *)0x0)) && (pVVar3->valueNumber == local_38->valueNumber)) {
      this_00 = pVVar3->valueInfo;
      bVar2 = ValueInfo::IsVarConstant(this_00);
      if ((bVar2) &&
         (pVVar4 = ValueInfo::AsVarConstant(this_00), pVVar4->varValue == addrOpnd->m_address))
      goto LAB_0042b3cd;
    }
  }
  else if (isString != false) {
    pJVar5 = JITJavascriptString::FromVar(addrOpnd->m_localAddress);
    Js::InternalString::InternalString
              ((InternalString *)&cachedInternalString.m_content,pJVar5->m_pszValue,
               pJVar5->m_charLength,'\0');
    bVar2 = JsUtil::
            BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<Js::InternalString>
                      (this->stringConstantToValueMap,
                       (InternalString *)&cachedInternalString.m_content,&local_38);
    if ((((bVar2) && (pSVar1 = local_38->valueInfo->symStore, pSVar1 != (Sym *)0x0)) &&
        ((bVar2 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,pSVar1), bVar2 &&
         ((pVVar3 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,pSVar1),
          pVVar3 != (Value *)0x0 && (pVVar3->valueNumber == local_38->valueNumber)))))) &&
       (bVar2 = ValueInfo::IsVarConstant(pVVar3->valueInfo), bVar2)) {
      pVVar4 = ValueInfo::AsVarConstant(pVVar3->valueInfo);
      var = pVVar4->localVarValue;
      if (var == (Var)0x0) {
        var = pVVar4->varValue;
      }
      pJVar5 = JITJavascriptString::FromVar(var);
      Js::InternalString::InternalString
                ((InternalString *)local_60,pJVar5->m_pszValue,pJVar5->m_charLength,'\0');
      bVar2 = Js::InternalStringComparer::Equals
                        ((InternalString *)&cachedInternalString.m_content,
                         (InternalString *)local_60);
      if (bVar2) goto LAB_0042b3cd;
    }
  }
  pVVar3 = NewVarConstantValue(this,addrOpnd,isString);
LAB_0042b3cd:
  IR::Opnd::SetValueType
            (&addrOpnd->super_Opnd,
             (ValueType)
             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
              &(pVVar3->valueInfo->super_ValueType).field_0.field_0);
  return pVVar3;
}

Assistant:

Value *
GlobOpt::GetVarConstantValue(IR::AddrOpnd *addrOpnd)
{
    bool isVar = addrOpnd->IsVar();
    bool isString = isVar && addrOpnd->m_localAddress && JITJavascriptString::Is(addrOpnd->m_localAddress);
    Value *val = nullptr;
    Value *cachedValue = nullptr;
    if(this->addrConstantToValueMap->TryGetValue(addrOpnd->m_address, &cachedValue))
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
        if(symStore && CurrentBlockData()->IsLive(symStore))
        {
            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            if(symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
            {
                ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                if(symStoreValueInfo->IsVarConstant() && symStoreValueInfo->AsVarConstant()->VarValue() == addrOpnd->m_address)
                {
                    val = symStoreValue;
                }
            }
        }
    }
    else if (isString)
    {
        JITJavascriptString* jsString = JITJavascriptString::FromVar(addrOpnd->m_localAddress);
        Js::InternalString internalString(jsString->GetString(), jsString->GetLength());
        if (this->stringConstantToValueMap->TryGetValue(internalString, &cachedValue))
        {
            Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
            if (symStore && CurrentBlockData()->IsLive(symStore))
            {
                Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
                if (symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
                {
                    ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                    if (symStoreValueInfo->IsVarConstant())
                    {
                        JITJavascriptString * cachedString = JITJavascriptString::FromVar(symStoreValue->GetValueInfo()->AsVarConstant()->VarValue(true));
                        Js::InternalString cachedInternalString(cachedString->GetString(), cachedString->GetLength());
                        if (Js::InternalStringComparer::Equals(internalString, cachedInternalString))
                        {
                            val = symStoreValue;
                        }
                    }
                }
            }
        }
    }

    if(!val)
    {
        val = NewVarConstantValue(addrOpnd, isString);
    }

    addrOpnd->SetValueType(val->GetValueInfo()->Type());
    return val;
}